

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

quad_value_bit_vector *
bsim::lshr(quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a,
          quad_value_bit_vector *shift_amount)

{
  int iVar1;
  pointer pqVar2;
  long lVar3;
  byte bVar4;
  unsigned_short uVar5;
  uint uVar6;
  uint uVar7;
  quad_value_bit_vector *extraout_RAX;
  quad_value_bit_vector *extraout_RAX_00;
  quad_value_bit_vector *extraout_RAX_01;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  string *other;
  quad_value_bit_vector res;
  string local_50;
  
  iVar1 = a->N;
  uVar12 = (ulong)iVar1;
  if ((long)uVar12 < 1) {
LAB_00186ca2:
    uVar12 = (ulong)shift_amount->N;
    if ((long)uVar12 < 1) {
LAB_00186d53:
      quad_value_bit_vector::quad_value_bit_vector((quad_value_bit_vector *)&local_50,iVar1);
      iVar1 = shift_amount->N;
      if (0x40 < iVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x3b0,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
      }
      if (iVar1 < 0x21) {
        if (iVar1 < 0x11) {
          if (iVar1 < 9) {
            bVar4 = quad_value_bit_vector::to_type<unsigned_char>(shift_amount);
            uVar12 = (ulong)bVar4;
          }
          else {
            uVar5 = quad_value_bit_vector::to_type<unsigned_short>(shift_amount);
            uVar12 = (ulong)uVar5;
          }
        }
        else {
          uVar6 = quad_value_bit_vector::to_type<unsigned_int>(shift_amount);
          uVar12 = (ulong)uVar6;
        }
      }
      else {
        uVar12 = quad_value_bit_vector::to_type<unsigned_long>(shift_amount);
      }
      if (0x40 < uVar12) {
        __assert_fail("shift_int < 65",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x3c2,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
      }
      other = (string *)a;
      if (uVar12 != 0) {
        uVar6 = a->N;
        uVar8 = (ulong)uVar6;
        uVar7 = (uint)uVar12;
        if ((int)uVar7 < (int)uVar6) {
          lVar10 = (ulong)(~uVar7 + uVar6) << 0x20;
          do {
            lVar3 = uVar8 - 1;
            uVar8 = uVar8 - 1;
            local_50._M_dataplus._M_p[lVar10 >> 0x20] =
                 (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar3].value;
            lVar10 = lVar10 + -0x100000000;
          } while ((long)uVar12 < (long)uVar8);
          uVar6 = a->N;
        }
        lVar10 = (long)(int)uVar6;
        do {
          local_50._M_dataplus._M_p[lVar10 + -1] = '\0';
          lVar10 = lVar10 + -1;
          other = &local_50;
        } while ((long)a->N - (long)(int)uVar7 < lVar10);
      }
      quad_value_bit_vector::quad_value_bit_vector
                (__return_storage_ptr__,(quad_value_bit_vector *)other);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return extraout_RAX_01;
      }
      goto LAB_00186d3f;
    }
    pqVar2 = (shift_amount->bits).
             super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pqVar2->value < 2) {
      uVar8 = 1;
      do {
        uVar9 = uVar8;
        if (uVar12 == uVar9) break;
        uVar8 = uVar9 + 1;
      } while (pqVar2[uVar9].value < 2);
      if (uVar12 <= uVar9) goto LAB_00186d53;
    }
LAB_00186cd4:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    if (0 < iVar1) goto LAB_00186d07;
  }
  else {
    pqVar2 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pqVar2->value < 2) {
      uVar8 = 1;
      do {
        uVar9 = uVar8;
        if (uVar12 == uVar9) break;
        uVar8 = uVar9 + 1;
      } while (pqVar2[uVar9].value < 2);
      if (uVar12 <= uVar9) goto LAB_00186ca2;
      goto LAB_00186cd4;
    }
LAB_00186d07:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_string_length = 0;
    iVar11 = iVar1;
    do {
      std::__cxx11::string::append((char *)&local_50);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,iVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return extraout_RAX;
  }
LAB_00186d3f:
  operator_delete(local_50._M_dataplus._M_p);
  return extraout_RAX_00;
}

Assistant:

static inline quad_value_bit_vector
  lshr(const quad_value_bit_vector& a,
       const quad_value_bit_vector& shift_amount) {

    if (!a.is_binary() || !shift_amount.is_binary()) {
      return unknown_bv(a.bitLength());
    }
    
    quad_value_bit_vector res(a.bitLength());

    bv_uint64 shift_int = get_shift_int(shift_amount);

    if (shift_int == 0) {
      return a;
    }

    //unsigned char sign_bit = a.get(a.bitLength() - 1);
    for (int i = a.bitLength() - 1; i >= (int) shift_int; i--) {
      res.set(i - shift_int, a.get(i));
    }

    for (int i = a.bitLength() - 1; i >= (((int) a.bitLength()) - ((int) shift_int)); i--) {
      res.set(i, 0);
    }

    return res;
  }